

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseaudio.c
# Opt level: O0

pa_simple * pulseaudio_initialize(uchar channels_number,char *appname)

{
  pa_simple *ppVar1;
  char *local_38;
  undefined4 local_2c;
  undefined4 local_28;
  pa_sample_spec ss;
  pa_simple *s;
  char *appname_local;
  uchar channels_number_local;
  
  local_2c = 3;
  local_28 = 48000;
  local_38 = appname;
  if (appname == (char *)0x0) {
    local_38 = "AIS Demodulator";
  }
  ss.format._0_1_ = channels_number;
  ppVar1 = (pa_simple *)pa_simple_new(0,local_38,2,0,"AIS data",&local_2c,0,0,0);
  return ppVar1;
}

Assistant:

pa_simple *pulseaudio_initialize(unsigned char channels_number, const char *appname) {

    pa_simple *s;
    pa_sample_spec ss;

    ss.format = PA_SAMPLE_S16NE;
    ss.channels = channels_number;
    ss.rate = 48000;

    s = pa_simple_new(NULL,
                      (appname != NULL) ? appname : "AIS Demodulator",
                      PA_STREAM_RECORD, NULL, "AIS data", &ss, NULL, NULL, NULL);

    return s;
}